

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O3

void __thiscall duckdb::RenameColumnInfo::~RenameColumnInfo(RenameColumnInfo *this)

{
  pointer pcVar1;
  
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__RenameColumnInfo_02450010;
  pcVar1 = (this->new_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->new_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->old_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->old_name).field_2) {
    operator_delete(pcVar1);
  }
  AlterViewInfo::~AlterViewInfo((AlterViewInfo *)this);
  return;
}

Assistant:

RenameColumnInfo::~RenameColumnInfo() {
}